

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O0

void small_mempool_group_sweep_sparse(small_alloc *alloc)

{
  _Bool _Var1;
  small_mempool *small_mempool;
  small_mempool *pool;
  uint i;
  small_alloc *alloc_local;
  
  for (pool._4_4_ = 0; pool._4_4_ < alloc->small_mempool_cache_size; pool._4_4_ = pool._4_4_ + 1) {
    small_mempool = alloc->small_mempool_cache + pool._4_4_;
    _Var1 = small_mempool_can_be_deactivated(small_mempool);
    if ((_Var1) &&
       (small_mempool_deactivate(small_mempool), (small_mempool->pool).spare != (mslab *)0x0)) {
      mempool_free_spare_slab(&small_mempool->pool);
    }
  }
  return;
}

Assistant:

static inline void
small_mempool_group_sweep_sparse(struct small_alloc *alloc)
{
	for (unsigned i = 0; i < alloc->small_mempool_cache_size; i++) {
		struct small_mempool *pool = &alloc->small_mempool_cache[i];
		if (small_mempool_can_be_deactivated(pool)) {
			small_mempool_deactivate(pool);
			if (pool->pool.spare != NULL)
				mempool_free_spare_slab(&pool->pool);
		}
	}
}